

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O2

void FileSystemTest::SetUpTestCase(void)

{
  char *in_R9;
  string local_210;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  std::filesystem::__cxx11::path::path<char[21],std::filesystem::__cxx11::path>
            ((path *)&local_198,(char (*) [21])"./testdata/empty.bin",auto_format);
  iutest_ar.m_result =
       (bool)std::filesystem::copy_file((path *)&local_198,&largefile_abi_cxx11_,overwrite_existing)
  ;
  iutest_ar.m_message._M_dataplus._M_p = (pointer)&iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  std::filesystem::__cxx11::path::~path((path *)&local_198);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)&iutest_ar,
               (AssertionResult *)
               "::std::filesystem::copy_file(\"./testdata/empty.bin\", largefile, ::std::filesystem::copy_options::overwrite_existing)"
               ,"false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
               ,0x54,local_210._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

static void SetUpTestCase(void)
    {
        IUTEST_ASSERT_TRUE(::std::filesystem::copy_file("./testdata/empty.bin", largefile, ::std::filesystem::copy_options::overwrite_existing));
    }